

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall
SAT::analyze(SAT *this,int nodeid,
            set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  Clause **ppCVar5;
  Clause *pCVar6;
  _Iter_comp_iter<SAT::LitSort> __comp;
  Lit *pLVar7;
  double dVar8;
  IntVar **ppIVar9;
  bool bVar10;
  int iVar11;
  uint64_t d1;
  long lVar12;
  ulong uVar13;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar14;
  ulong uVar15;
  int iVar16;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar17;
  size_t sVar18;
  int iVar19;
  Lit *pLVar20;
  double dVar21;
  Clause *c;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  Lit local_4c;
  vec<Lit> local_48;
  
  psVar17 = (set<int,_std::less<int>,_std::allocator<int>_> *)(ulong)(uint)nodeid;
  this->avg_depth = ((double)(int)((this->trail).sz - 1) - this->avg_depth) * 0.01 + this->avg_depth
  ;
  checkConflict(this);
  dVar21 = this->var_inc * 1.05;
  this->var_inc = dVar21;
  if (1e+100 < dVar21) {
    lVar12 = (long)(int)(this->assigns).sz;
    if (0 < lVar12) {
      pdVar4 = (this->activity).data;
      lVar14 = 0;
      do {
        pdVar4[lVar14] = pdVar4[lVar14] * 1e-100;
        lVar14 = lVar14 + 1;
      } while (lVar12 != lVar14);
    }
    ppIVar9 = engine.vars.data;
    uVar13 = (ulong)engine.vars.sz;
    if (uVar13 != 0) {
      uVar15 = 0;
      do {
        ppIVar9[uVar15]->activity = ppIVar9[uVar15]->activity * 1e-100;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  dVar21 = this->cla_inc * 1.001;
  this->cla_inc = dVar21;
  if (1e+20 < dVar21) {
    this->cla_inc = dVar21 * 1e-20;
    uVar13 = (ulong)(this->learnts).sz;
    if (uVar13 != 0) {
      ppCVar5 = (this->learnts).data;
      uVar15 = 0;
      do {
        pCVar6 = ppCVar5[uVar15];
        pCVar6->data[*(uint *)pCVar6 >> 8].x =
             (int)((float)pCVar6->data[*(uint *)pCVar6 >> 8].x * 1e-20);
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
  }
  getLearntClause(this,nodeid,contributingNogoods);
  explainUnlearnable(this,psVar17);
  if (so.exhaustive_activity == true) {
    explainToExhaustion(this,contributingNogoods);
  }
  clearSeen(this);
  iVar11 = findBackTrackLevel(this);
  this->back_jumps = this->back_jumps + (long)(int)(((this->trail).sz - iVar11) + -2);
  btToLevel(this,iVar11);
  this->confl = (Clause *)0x0;
  if ((so.sort_learnt_level == true) && (uVar13 = (ulong)(this->out_learnt).sz, 3 < uVar13)) {
    __comp._M_comp.level = (LitSort)(this->lit_sort).level;
    pLVar20 = (this->out_learnt).data;
    pLVar7 = pLVar20 + uVar13;
    pLVar20 = pLVar20 + 2;
    uVar13 = uVar13 * 4 - 8 >> 2;
    lVar12 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::__introsort_loop<Lit*,long,__gnu_cxx::__ops::_Iter_comp_iter<SAT::LitSort>>
              (pLVar20,pLVar7,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,__comp);
    std::__final_insertion_sort<Lit*,__gnu_cxx::__ops::_Iter_comp_iter<SAT::LitSort>>
              (pLVar20,pLVar7,__comp);
  }
  uVar3 = (this->out_learnt).sz;
  sVar18 = 0x14;
  if (uVar3 != 0) {
    sVar18 = (ulong)(uVar3 - 1) * 4 + 0x14;
  }
  r._pt = (Clause *)malloc(sVar18);
  Clause::Clause<vec<Lit>>(r._pt,&this->out_learnt,true);
  uVar3 = *(uint *)r._pt;
  uVar13 = (ulong)(uVar3 >> 8);
  (r._pt)->data[uVar13].x = (int)(float)this->cla_inc;
  ((Clause *)(r._a + 8))->data[uVar13 - 1].x = 1;
  ((Lit *)(r._a + 0xc))[uVar13].x = nodeid;
  local_58._pt = r._pt;
  if (uVar3 < 0x20000) {
    if (((byte)engine.conflicts & 0xf) == 0) {
      lVar12 = std::chrono::_V2::steady_clock::now();
      dVar8 = exp(((double)((lVar12 - (this->ll_time).__d.__r) / 1000000) / 1000.0) /
                  this->learnt_len_el);
      dVar21 = this->ll_inc * dVar8;
      this->ll_inc = dVar21;
      if (1e+100 < dVar21) {
        pdVar4 = (this->learnt_len_occ).data;
        lVar14 = 0;
        do {
          pdVar1 = pdVar4 + lVar14;
          dVar21 = pdVar1[1];
          pdVar2 = pdVar4 + lVar14;
          *pdVar2 = *pdVar1 * 1e-100;
          pdVar2[1] = dVar21 * 1e-100;
          lVar14 = lVar14 + 2;
        } while (lVar14 != 0x200);
        dVar21 = this->ll_inc * 1e-100;
        this->ll_inc = dVar21;
      }
      (this->ll_time).__d.__r = lVar12;
      this->confl_rate = this->confl_rate / dVar8;
    }
    else {
      dVar21 = this->ll_inc;
    }
    pdVar4 = (this->learnt_len_occ).data;
    pdVar4[uVar13] = dVar21 + pdVar4[uVar13];
    this->confl_rate = 1.0 / this->learnt_len_el + this->confl_rate;
  }
  if ((so.learn == true) && (0x1ff < *(uint *)r._pt)) {
    addClause(this,r._pt,so.one_watch);
  }
  if (((so.learn & 1U) == 0) || ((so.bin_clause_opt == true && (*(uint *)r._pt < 0x300)))) {
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&local_58._pt);
    r = local_58;
  }
  pLVar7 = (this->out_learnt).data;
  if (((so.bin_clause_opt & 1U) != 0) && (((ulong)*r._pt & 0xffffff00) == 0x200)) {
    r._pt = (Clause *)((long)pLVar7[1].x * 4 + 2);
  }
  enqueue(this,(Lit)pLVar7->x,(Reason)r);
  if (so.ldsbad == true) {
    local_48.sz = 0;
    local_48.cap = 0;
    local_48.data = (Lit *)0x0;
    vec<Lit>::push(&local_48,(this->out_learnt).data);
    iVar11 = (this->trail).sz - 1;
    if (0 < iVar11) {
      iVar16 = 0;
      iVar19 = 0;
      do {
        local_4c.x = ((this->trail).data[(uint)(iVar11 + iVar16)].data)->x ^ 1;
        vec<Lit>::push(&local_48,&local_4c);
        iVar19 = iVar19 + 1;
        iVar11 = (this->trail).sz - 1;
        iVar16 = iVar16 + -1;
      } while (iVar19 < iVar11);
    }
    uVar3 = local_48.sz;
    uVar13 = local_48._0_8_ & 0xffffffff;
    sVar18 = 0x14;
    if (local_48.sz != 0) {
      sVar18 = (ulong)(local_48.sz - 1) * 4 + 0x14;
    }
    local_58._pt = (Clause *)malloc(sVar18);
    (local_58._pt)->data[0].x = -2;
    *(uint *)local_58._pt = uVar3 * 0x100 + 1;
    if (uVar3 != 0) {
      uVar15 = 0;
      do {
        (local_58._pt)->data[uVar15].x = local_48.data[uVar15].x;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&local_58._pt);
    if (local_48.data != (Lit *)0x0) {
      free(local_48.data);
    }
  }
  if ((so.ldsb == true) && (bVar10 = LDSB::processImpl(&ldsb,local_58._pt), !bVar10)) {
    engine.async_fail = true;
  }
  if ((int)(this->learnts).sz < so.nof_learnts) {
    iVar11 = so.learnts_mlimit + 3;
    if (-1 < so.learnts_mlimit) {
      iVar11 = so.learnts_mlimit;
    }
    if (this->learnts_literals < (long)(iVar11 >> 2)) {
      return;
    }
  }
  reduceDB(this);
  return;
}

Assistant:

void SAT::analyze(int nodeid, std::set<int>& contributingNogoods) {
	avg_depth += 0.01 * (decisionLevel() - avg_depth);

	/* if (so.debug) { */
	/*   std::cerr << "trail:\n"; */
	/*   for (int i = 0 ; i < trail.size() ; i++) { */
	/*     std::cerr << "level " << i << ":"; */
	/*     for (int j = 0 ; j < trail[i].size() ; j++) { */
	/*       Lit& lit = trail[i][j]; */
	/*       std::cerr << " " << getLitString(toInt(lit)); */
	/*     } */
	/*     std::cerr << "\n"; */
	/*   } */
	/* } */

	checkConflict();
	varDecayActivity();
	claDecayActivity();
	getLearntClause(nodeid, contributingNogoods);
	explainUnlearnable(contributingNogoods);
	if (so.exhaustive_activity) {
		explainToExhaustion(contributingNogoods);
	}
	clearSeen();

	const int btlevel = findBackTrackLevel();
	back_jumps += decisionLevel() - 1 - btlevel;
	//	fprintf(stderr, "btlevel = %d\n", btlevel);
	btToLevel(btlevel);
	confl = nullptr;

	if (so.sort_learnt_level && out_learnt.size() >= 4) {
		std::sort((Lit*)out_learnt + 2, (Lit*)out_learnt + out_learnt.size(), lit_sort);
	}

#if DEBUG_VERBOSE
	std::cerr << "out_learnt:";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << toInt(out_learnt[i]);
	}
	std::cerr << "\n";
	std::cerr << "out_learnt (interpreted):";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << litString[toInt(out_learnt[i])];
	}
	std::cerr << "\n";
#endif

	Clause* c = Clause_new(out_learnt, true);
	c->activity() = static_cast<float>(cla_inc);
	c->rawActivity() = 1;
	c->clauseID() = nodeid;

	learntLenBumpActivity(c->size());

	/* std::cerr << "conflict found clause of length " << c->size() << "\n"; */

	/* if (c->size() == 1) { */
	/*     std::cerr << "learntfact: " << getLitString(toInt((*c)[0])) << "\n"; */
	/* } */

	if (so.learn && c->size() >= 2) {
		addClause(*c, so.one_watch);
	}

	if (!so.learn || (so.bin_clause_opt && c->size() <= 2)) {
		rtrail.last().push(c);
	}

	enqueue(out_learnt[0], (so.bin_clause_opt && c->size() == 2) ? Reason(out_learnt[1]) : c);

	if (PRINT_ANALYSIS) {
		printClause(*c);
	}

	if (so.ldsbad) {
		vec<Lit> out_learnt2;
		out_learnt2.push(out_learnt[0]);
		for (int i = 0; i < decisionLevel(); i++) {
			out_learnt2.push(~decLit(decisionLevel() - i));
		}
		c = Clause_new(out_learnt2, true);
		rtrail.last().push(c);
	}

	if (so.ldsb && !ldsb.processImpl(c)) {
		engine.async_fail = true;
	}

	if (static_cast<int>(learnts.size()) >= so.nof_learnts ||
			learnts_literals >= so.learnts_mlimit / 4) {
		reduceDB();
	}
}